

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMatrixAttribute.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Matrix44<float>_>::writeValueTo
          (TypedAttribute<Imath_2_5::Matrix44<float>_> *this,OStream *os,int version)

{
  OStream *in_RSI;
  long in_RDI;
  float in_stack_ffffffffffffff5c;
  
  Imath_2_5::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),0);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_RSI,in_stack_ffffffffffffff5c);
  Imath_2_5::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),0);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_RSI,in_stack_ffffffffffffff5c);
  Imath_2_5::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),0);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_RSI,in_stack_ffffffffffffff5c);
  Imath_2_5::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),0);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_RSI,in_stack_ffffffffffffff5c);
  Imath_2_5::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),1);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_RSI,in_stack_ffffffffffffff5c);
  Imath_2_5::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),1);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_RSI,in_stack_ffffffffffffff5c);
  Imath_2_5::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),1);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_RSI,in_stack_ffffffffffffff5c);
  Imath_2_5::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),1);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_RSI,in_stack_ffffffffffffff5c);
  Imath_2_5::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),2);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_RSI,in_stack_ffffffffffffff5c);
  Imath_2_5::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),2);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_RSI,in_stack_ffffffffffffff5c);
  Imath_2_5::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),2);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_RSI,in_stack_ffffffffffffff5c);
  Imath_2_5::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),2);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_RSI,in_stack_ffffffffffffff5c);
  Imath_2_5::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),3);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_RSI,in_stack_ffffffffffffff5c);
  Imath_2_5::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),3);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_RSI,in_stack_ffffffffffffff5c);
  Imath_2_5::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),3);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_RSI,in_stack_ffffffffffffff5c);
  Imath_2_5::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),3);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_RSI,in_stack_ffffffffffffff5c);
  return;
}

Assistant:

void
M44fAttribute::writeValueTo (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os, int version) const
{
    Xdr::write <StreamIO> (os, _value[0][0]);
    Xdr::write <StreamIO> (os, _value[0][1]);
    Xdr::write <StreamIO> (os, _value[0][2]);
    Xdr::write <StreamIO> (os, _value[0][3]);

    Xdr::write <StreamIO> (os, _value[1][0]);
    Xdr::write <StreamIO> (os, _value[1][1]);
    Xdr::write <StreamIO> (os, _value[1][2]);
    Xdr::write <StreamIO> (os, _value[1][3]);

    Xdr::write <StreamIO> (os, _value[2][0]);
    Xdr::write <StreamIO> (os, _value[2][1]);
    Xdr::write <StreamIO> (os, _value[2][2]);
    Xdr::write <StreamIO> (os, _value[2][3]);

    Xdr::write <StreamIO> (os, _value[3][0]);
    Xdr::write <StreamIO> (os, _value[3][1]);
    Xdr::write <StreamIO> (os, _value[3][2]);
    Xdr::write <StreamIO> (os, _value[3][3]);
}